

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::AssertionPrinter::printResultType(AssertionPrinter *this)

{
  ostream *poVar1;
  Colour colourGuard;
  Colour local_11;
  
  if ((this->passOrFail)._M_string_length != 0) {
    Colour::Colour(&local_11,this->colour);
    poVar1 = std::operator<<(this->stream,(string *)&this->passOrFail);
    std::operator<<(poVar1,":\n");
    Colour::~Colour(&local_11);
  }
  return;
}

Assistant:

static bool evaluate( T1 const& lhs, T2 const& rhs ) {
            return opCast( lhs ) >= opCast( rhs );
        }